

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O0

void ssh1_login_agent_query(ssh1_login_state *s,strbuf *req)

{
  agent_pending_query *paVar1;
  int local_24;
  void *pvStack_20;
  int response_len;
  void *response;
  strbuf *req_local;
  ssh1_login_state *s_local;
  
  response = req;
  req_local = (strbuf *)s;
  safefree(s->agent_response_to_free);
  req_local[4].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  paVar1 = agent_query((strbuf *)response,&stack0xffffffffffffffe0,&local_24,
                       ssh1_login_agent_callback,req_local);
  req_local[1].binarysink_[0].binarysink_ = (BinarySink *)paVar1;
  if (req_local[1].binarysink_[0].binarysink_ == (BinarySink *)0x0) {
    ssh1_login_agent_callback(req_local,pvStack_20,local_24);
  }
  return;
}

Assistant:

static void ssh1_login_agent_query(struct ssh1_login_state *s, strbuf *req)
{
    void *response;
    int response_len;

    sfree(s->agent_response_to_free);
    s->agent_response_to_free = NULL;

    s->auth_agent_query = agent_query(req, &response, &response_len,
                                      ssh1_login_agent_callback, s);
    if (!s->auth_agent_query)
        ssh1_login_agent_callback(s, response, response_len);
}